

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

string * __thiscall Matrix::ToString_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  int iVar1;
  const_reference this_00;
  const_reference f;
  int local_198;
  int local_194;
  int j;
  int i;
  ostringstream out;
  Matrix *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&j);
  local_194 = 0;
  while( true ) {
    iVar1 = GetNumRows(this);
    if (iVar1 <= local_194) break;
    local_198 = 0;
    while( true ) {
      iVar1 = GetNumColumns(this);
      if (iVar1 <= local_198) break;
      if (0 < local_198) {
        std::operator<<((ostream *)&j," ");
      }
      this_00 = std::
                vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                ::operator[](&this->elements_,(long)local_194);
      f = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](this_00,(long)local_198);
      operator<<((ostream *)&j,f);
      local_198 = local_198 + 1;
    }
    iVar1 = GetNumRows(this);
    if (local_194 + 1 != iVar1) {
      std::ostream::operator<<(&j,std::endl<char,std::char_traits<char>>);
    }
    local_194 = local_194 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&j);
  return __return_storage_ptr__;
}

Assistant:

std::string Matrix::ToString() const {
  std::ostringstream out;
  for (int i = 0; i < GetNumRows(); ++i) {
    for (int j = 0; j < GetNumColumns(); ++j) {
      if (j > 0) {
        out << " ";
      }
      out << elements_[i][j];
    }
    if (i + 1 != GetNumRows()) {
      out << std::endl;
    }
  }

  return out.str();
}